

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_typeSlotAtPut
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t tuple;
  size_t slotIndex;
  sysbvm_context_t *context_00;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  context_00 = (sysbvm_context_t *)arguments[1];
  if (context_00 == (sysbvm_context_t *)0x0 || ((ulong)context_00 & 0xf) != 0) {
    sysbvm_error_nullArgument();
    context_00 = (sysbvm_context_t *)arguments[1];
  }
  tuple = *arguments;
  slotIndex = sysbvm_typeSlot_getIndex((sysbvm_tuple_t)context_00);
  sysbvm_tuple_slotAtPut(context_00,tuple,slotIndex,arguments[2]);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_typeSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[1])) sysbvm_error_nullArgument();

    sysbvm_tuple_slotAtPut(context, arguments[0], sysbvm_typeSlot_getIndex(arguments[1]), arguments[2]);
    return SYSBVM_VOID_TUPLE;
}